

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsaStreamComponent_FinishConfigure
                  (PaAlsaStreamComponent *self,snd_pcm_hw_params_t *hwParams,
                  PaStreamParameters *params,int primeBuffers,double sampleRate,PaTime *latency)

{
  snd_pcm_t *psVar1;
  snd_pcm_uframes_t sVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  size_t __n;
  long lVar7;
  pthread_t pVar9;
  char *pcVar10;
  char *errorText;
  undefined1 *__s;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uStack_60;
  undefined1 auStack_58 [8];
  ulong local_50;
  undefined8 local_48;
  snd_pcm_uframes_t boundary;
  double local_38;
  ulong uVar8;
  
  *latency = -1.0;
  uStack_60 = 0x10c429;
  boundary = (snd_pcm_uframes_t)latency;
  local_38 = sampleRate;
  __n = snd_pcm_sw_params_sizeof();
  lVar4 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = auStack_58 + lVar4;
  *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c447;
  memset(__s,0,__n);
  auVar12._0_8_ = (double)CONCAT44(0x43300000,(int)self->framesPerPeriod);
  auVar12._8_4_ = (int)(self->framesPerPeriod >> 0x20);
  auVar12._12_4_ = 0x45300000;
  dVar11 = params->suggestedLatency * local_38 +
           (auVar12._8_8_ - 1.9342813113834067e+25) + (auVar12._0_8_ - 4503599627370496.0);
  local_50 = (ulong)dVar11;
  local_50 = (long)(dVar11 - 9.223372036854776e+18) & (long)local_50 >> 0x3f | local_50;
  psVar1 = self->pcm;
  *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c4a8;
  iVar5 = snd_pcm_hw_params_set_buffer_size_near(psVar1,hwParams);
  if (iVar5 < 0) {
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c62b;
    pVar9 = pthread_self();
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c63d;
    iVar6 = pthread_equal(pVar9,paUnixMainThread);
    if (iVar6 != 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c64c;
      pcVar10 = (char *)snd_strerror(iVar5);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
      uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c65a;
      PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
    }
    pcVar10 = 
    "Expression \'alsa_snd_pcm_hw_params_set_buffer_size_near( self->pcm, hwParams, &bufSz )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2079\n"
    ;
    goto LAB_0010c944;
  }
  psVar1 = self->pcm;
  *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c4bc;
  iVar5 = snd_pcm_hw_params(psVar1,hwParams);
  if (iVar5 < 0) {
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c66e;
    pVar9 = pthread_self();
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c680;
    iVar6 = pthread_equal(pVar9,paUnixMainThread);
    if (iVar6 != 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c68f;
      pcVar10 = (char *)snd_strerror(iVar5);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
      uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c69d;
      PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
    }
    pcVar10 = 
    "Expression \'r\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2092\n"
    ;
    goto LAB_0010c944;
  }
  if (alsa_snd_pcm_hw_params_get_buffer_size == (undefined1 *)0x0) {
    self->alsaBufferSize = local_50;
    uVar8 = local_50;
  }
  else {
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c4e0;
    iVar5 = snd_pcm_hw_params_get_buffer_size(hwParams,&self->alsaBufferSize);
    if (iVar5 < 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c882;
      pVar9 = pthread_self();
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c894;
      iVar6 = pthread_equal(pVar9,paUnixMainThread);
      if (iVar6 != 0) {
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c8a3;
        pcVar10 = (char *)snd_strerror(iVar5);
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
        uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c8b1;
        PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
      }
      pcVar10 = 
      "Expression \'alsa_snd_pcm_hw_params_get_buffer_size( hwParams, &self->alsaBufferSize )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2096\n"
      ;
      goto LAB_0010c944;
    }
    uVar8 = self->alsaBufferSize;
  }
  lVar7 = uVar8 - self->framesPerPeriod;
  auVar13._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar13._0_8_ = lVar7;
  auVar13._12_4_ = 0x45300000;
  *(double *)boundary =
       ((auVar13._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / local_38;
  psVar1 = self->pcm;
  *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c537;
  iVar5 = snd_pcm_sw_params_current(psVar1,__s);
  if (iVar5 < 0) {
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c6b1;
    pVar9 = pthread_self();
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c6c3;
    iVar6 = pthread_equal(pVar9,paUnixMainThread);
    if (iVar6 != 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c6d2;
      pcVar10 = (char *)snd_strerror(iVar5);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
      uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c6e0;
      PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
    }
    pcVar10 = 
    "Expression \'alsa_snd_pcm_sw_params_current( self->pcm, swParams )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2107\n"
    ;
    goto LAB_0010c944;
  }
  psVar1 = self->pcm;
  sVar2 = self->framesPerPeriod;
  *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c54f;
  iVar5 = snd_pcm_sw_params_set_start_threshold(psVar1,__s,sVar2);
  if (iVar5 < 0) {
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c6f4;
    pVar9 = pthread_self();
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c706;
    iVar6 = pthread_equal(pVar9,paUnixMainThread);
    if (iVar6 != 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c715;
      pcVar10 = (char *)snd_strerror(iVar5);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
      uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c723;
      PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
    }
    pcVar10 = 
    "Expression \'alsa_snd_pcm_sw_params_set_start_threshold( self->pcm, swParams, self->framesPerPeriod )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2109\n"
    ;
    goto LAB_0010c944;
  }
  psVar1 = self->pcm;
  sVar2 = self->alsaBufferSize;
  *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c567;
  iVar5 = snd_pcm_sw_params_set_stop_threshold(psVar1,__s,sVar2);
  if (iVar5 < 0) {
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c737;
    pVar9 = pthread_self();
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c749;
    iVar6 = pthread_equal(pVar9,paUnixMainThread);
    if (iVar6 != 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c758;
      pcVar10 = (char *)snd_strerror(iVar5);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
      uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c766;
      PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
    }
    pcVar10 = 
    "Expression \'alsa_snd_pcm_sw_params_set_stop_threshold( self->pcm, swParams, self->alsaBufferSize )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2110\n"
    ;
    goto LAB_0010c944;
  }
  if (primeBuffers == 0) {
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c580;
    iVar5 = snd_pcm_sw_params_get_boundary(__s,&local_48);
    if (iVar5 < 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c8c5;
      pVar9 = pthread_self();
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c8d7;
      iVar6 = pthread_equal(pVar9,paUnixMainThread);
      pcVar10 = 
      "Expression \'alsa_snd_pcm_sw_params_get_boundary( swParams, &boundary )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2116\n"
      ;
    }
    else {
      psVar1 = self->pcm;
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c596;
      iVar5 = snd_pcm_sw_params_set_silence_threshold(psVar1,__s,0);
      if (iVar5 < 0) {
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c8e8;
        pVar9 = pthread_self();
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c8fa;
        iVar6 = pthread_equal(pVar9,paUnixMainThread);
        pcVar10 = 
        "Expression \'alsa_snd_pcm_sw_params_set_silence_threshold( self->pcm, swParams, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2117\n"
        ;
      }
      else {
        psVar1 = self->pcm;
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c5ae;
        iVar5 = snd_pcm_sw_params_set_silence_size(psVar1,__s,local_48);
        if (-1 < iVar5) goto LAB_0010c5b6;
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c90b;
        pVar9 = pthread_self();
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c91d;
        iVar6 = pthread_equal(pVar9,paUnixMainThread);
        pcVar10 = 
        "Expression \'alsa_snd_pcm_sw_params_set_silence_size( self->pcm, swParams, boundary )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2118\n"
        ;
      }
    }
    if (iVar6 != 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c933;
      errorText = (char *)snd_strerror(iVar5);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
      uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c941;
      PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,errorText);
    }
  }
  else {
LAB_0010c5b6:
    psVar1 = self->pcm;
    sVar2 = self->framesPerPeriod;
    *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c5c6;
    iVar5 = snd_pcm_sw_params_set_avail_min(psVar1,__s,sVar2);
    if (iVar5 < 0) {
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c77a;
      pVar9 = pthread_self();
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c78c;
      iVar6 = pthread_equal(pVar9,paUnixMainThread);
      if (iVar6 != 0) {
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c79b;
        pcVar10 = (char *)snd_strerror(iVar5);
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
        uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c7a9;
        PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
      }
      pcVar10 = 
      "Expression \'alsa_snd_pcm_sw_params_set_avail_min( self->pcm, swParams, self->framesPerPeriod )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2121\n"
      ;
    }
    else {
      psVar1 = self->pcm;
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 1;
      uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
      *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c5dd;
      iVar5 = snd_pcm_sw_params_set_xfer_align(psVar1,__s,uVar3);
      if (iVar5 < 0) {
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c7bd;
        pVar9 = pthread_self();
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c7cf;
        iVar6 = pthread_equal(pVar9,paUnixMainThread);
        if (iVar6 != 0) {
          *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c7de;
          pcVar10 = (char *)snd_strerror(iVar5);
          *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
          uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
          *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c7ec;
          PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
        }
        pcVar10 = 
        "Expression \'alsa_snd_pcm_sw_params_set_xfer_align( self->pcm, swParams, 1 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2122\n"
        ;
      }
      else {
        psVar1 = self->pcm;
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 1;
        uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
        *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c5f4;
        iVar5 = snd_pcm_sw_params_set_tstamp_mode(psVar1,__s,uVar3);
        if (iVar5 < 0) {
          *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c800;
          pVar9 = pthread_self();
          *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c812;
          iVar6 = pthread_equal(pVar9,paUnixMainThread);
          if (iVar6 != 0) {
            *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c821;
            pcVar10 = (char *)snd_strerror(iVar5);
            *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
            uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
            *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c82f;
            PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
          }
          pcVar10 = 
          "Expression \'alsa_snd_pcm_sw_params_set_tstamp_mode( self->pcm, swParams, SND_PCM_TSTAMP_ENABLE )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2123\n"
          ;
        }
        else {
          psVar1 = self->pcm;
          *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c608;
          iVar5 = snd_pcm_sw_params(psVar1,__s);
          if (-1 < iVar5) {
            return 0;
          }
          *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c840;
          pVar9 = pthread_self();
          *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c852;
          iVar6 = pthread_equal(pVar9,paUnixMainThread);
          if (iVar6 != 0) {
            *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c860;
            pcVar10 = (char *)snd_strerror(iVar5);
            *(undefined8 *)(auStack_58 + lVar4 + -8) = 8;
            uVar3 = *(undefined8 *)(auStack_58 + lVar4 + -8);
            *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c86e;
            PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar5,pcVar10);
          }
          pcVar10 = 
          "Expression \'alsa_snd_pcm_sw_params( self->pcm, swParams )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2126\n"
          ;
        }
      }
    }
  }
LAB_0010c944:
  *(undefined8 *)(auStack_58 + lVar4 + -8) = 0x10c94b;
  PaUtil_DebugPrint(pcVar10);
  return -9999;
}

Assistant:

static PaError PaAlsaStreamComponent_FinishConfigure( PaAlsaStreamComponent *self, snd_pcm_hw_params_t* hwParams,
        const PaStreamParameters *params, int primeBuffers, double sampleRate, PaTime* latency )
{
    PaError result = paNoError;
    snd_pcm_sw_params_t* swParams;
    snd_pcm_uframes_t bufSz = 0;
    *latency = -1.;

    alsa_snd_pcm_sw_params_alloca( &swParams );

    bufSz = params->suggestedLatency * sampleRate + self->framesPerPeriod;
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( self->pcm, hwParams, &bufSz ), paUnanticipatedHostError );

    /* Set the parameters! */
    {
        int r = alsa_snd_pcm_hw_params( self->pcm, hwParams );
#ifdef PA_ENABLE_DEBUG_OUTPUT
        if( r < 0 )
        {
            snd_output_t *output = NULL;
            alsa_snd_output_stdio_attach( &output, stderr, 0 );
            alsa_snd_pcm_hw_params_dump( hwParams, output );
        }
#endif
        ENSURE_( r, paUnanticipatedHostError );
    }
    if( alsa_snd_pcm_hw_params_get_buffer_size != NULL )
    {
        ENSURE_( alsa_snd_pcm_hw_params_get_buffer_size( hwParams, &self->alsaBufferSize ), paUnanticipatedHostError );
    }
    else
    {
        self->alsaBufferSize = bufSz;
    }

    /* Latency in seconds */
    *latency = (self->alsaBufferSize - self->framesPerPeriod) / sampleRate;

    /* Now software parameters... */
    ENSURE_( alsa_snd_pcm_sw_params_current( self->pcm, swParams ), paUnanticipatedHostError );

    ENSURE_( alsa_snd_pcm_sw_params_set_start_threshold( self->pcm, swParams, self->framesPerPeriod ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_sw_params_set_stop_threshold( self->pcm, swParams, self->alsaBufferSize ), paUnanticipatedHostError );

    /* Silence buffer in the case of underrun */
    if( !primeBuffers ) /* XXX: Make sense? */
    {
        snd_pcm_uframes_t boundary;
        ENSURE_( alsa_snd_pcm_sw_params_get_boundary( swParams, &boundary ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_sw_params_set_silence_threshold( self->pcm, swParams, 0 ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_sw_params_set_silence_size( self->pcm, swParams, boundary ), paUnanticipatedHostError );
    }

    ENSURE_( alsa_snd_pcm_sw_params_set_avail_min( self->pcm, swParams, self->framesPerPeriod ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_sw_params_set_xfer_align( self->pcm, swParams, 1 ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_sw_params_set_tstamp_mode( self->pcm, swParams, SND_PCM_TSTAMP_ENABLE ), paUnanticipatedHostError );

    /* Set the parameters! */
    ENSURE_( alsa_snd_pcm_sw_params( self->pcm, swParams ), paUnanticipatedHostError );

error:
    return result;
}